

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O0

void auto_arima_summary(auto_arima_object obj)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  bool bVar7;
  double dVar8;
  int drift;
  int mean;
  int ncxreg;
  int t;
  int pq;
  int i;
  auto_arima_object obj_local;
  
  iVar4 = obj->p + obj->q + obj->P + obj->Q + obj->M;
  iVar2 = obj->M;
  iVar3 = obj->r;
  if ((obj->method == 0) || (obj->method == 1)) {
    printf("\n\nExit Status \n");
    printf("Return Code : %d \n",(ulong)(uint)obj->retval);
    printf("Exit Message : ");
    if (obj->retval == 0) {
      printf("Input Error");
    }
    else if (obj->retval == 1) {
      printf("Probable Success");
    }
    else if (obj->retval == 4) {
      printf("Optimization Routine didn\'t converge");
    }
    else if (obj->retval == 7) {
      printf("Exogenous Variables are collinear");
    }
    else if (obj->retval == 10) {
      printf("Nonstationary AR part");
    }
    else if (obj->retval == 0xc) {
      printf("Nonstationary Seasonal AR part");
    }
    else if (obj->retval == 0xf) {
      printf("Optimization Routine Encountered Inf/Nan Values");
    }
  }
  printf("\n\n");
  printf("ARIMA Seasonal Order : ( %d, %d, %d) * (%d, %d, %d) \n",(ulong)(uint)obj->p,
         (ulong)(uint)obj->d,(ulong)(uint)obj->q,(ulong)(uint)obj->P,(ulong)(uint)obj->D,obj->Q);
  printf("\n");
  printf("%-20s%-20s%-20s \n\n","Coefficients","Value","Standard Error");
  for (t = 0; t < obj->p; t = t + 1) {
    dVar1 = obj->phi[t];
    dVar8 = sqrt(obj->vcov[t + iVar4 * t]);
    printf("AR%-15d%-20g%-20g \n",dVar1,SUB84(dVar8,0),(ulong)(t + 1));
  }
  for (t = 0; t < obj->q; t = t + 1) {
    iVar5 = obj->p + t;
    dVar1 = obj->theta[t];
    dVar8 = sqrt(obj->vcov[iVar5 + iVar4 * iVar5]);
    printf("MA%-15d%-20g%-20g \n",dVar1,SUB84(dVar8,0),(ulong)(t + 1));
  }
  for (t = 0; t < obj->P; t = t + 1) {
    iVar5 = obj->p + obj->q + t;
    dVar1 = obj->PHI[t];
    dVar8 = sqrt(obj->vcov[iVar5 + iVar4 * iVar5]);
    printf("SAR%-14d%-20g%-20g \n",dVar1,SUB84(dVar8,0),(ulong)(t + 1));
  }
  for (t = 0; t < obj->Q; t = t + 1) {
    iVar5 = obj->p + obj->q + obj->P + t;
    dVar1 = obj->THETA[t];
    dVar8 = sqrt(obj->vcov[iVar5 + iVar4 * iVar5]);
    printf("SMA%-14d%-20g%-20g \n",dVar1,SUB84(dVar8,0),(ulong)(t + 1));
  }
  printf("\n");
  mean = obj->p + obj->q + obj->P + obj->Q;
  if (iVar2 - iVar3 < 1) {
    printf("%-17s%-20g \n",obj->mean,"MEAN");
  }
  else {
    dVar1 = obj->mean;
    dVar8 = sqrt(obj->vcov[mean + iVar4 * mean]);
    printf("%-17s%-20g%-20g \n",dVar1,SUB84(dVar8,0),"MEAN");
    mean = mean + 1;
  }
  bVar7 = obj->idrift != 1;
  if (bVar7) {
    printf("%-17s%-20g \n",0,"TREND");
  }
  else {
    dVar1 = *obj->exog;
    dVar8 = sqrt(obj->vcov[mean + iVar4 * mean]);
    printf("%-17s%-20g%-20g \n",dVar1,SUB84(dVar8,0),"TREND");
    mean = mean + 1;
  }
  drift = (int)!bVar7;
  for (t = drift; t < obj->r; t = t + 1) {
    dVar1 = obj->exog[t];
    dVar8 = sqrt(obj->vcov[mean + iVar4 * mean]);
    printf("%-17s%-20g%-20g \n",dVar1,SUB84(dVar8,0),"EXOG");
    mean = mean + 1;
  }
  printf("\n");
  printf("%-17s%-20g \n",obj->sigma2,"SIGMA^2");
  printf("\n");
  printf("ESTIMATION METHOD : ");
  if (obj->method == 0) {
    printf("CSS-MLE");
  }
  else if (obj->method == 1) {
    printf("MLE");
  }
  else if (obj->method == 2) {
    printf("CSS");
  }
  printf("\n\n");
  printf("OPTIMIZATION METHOD : ");
  if (obj->optmethod == 0) {
    printf("Nelder-Mead");
  }
  else if (obj->optmethod == 1) {
    printf("Newton Line Search");
  }
  else if (obj->optmethod == 2) {
    printf("Newton Trust Region - Hook Step");
  }
  else if (obj->optmethod == 3) {
    printf("Newton Trust Region - Double Dog-Leg");
  }
  else if (obj->optmethod == 4) {
    printf("Conjugate Gradient");
  }
  else if (obj->optmethod == 5) {
    printf("BFGS");
  }
  else if (obj->optmethod == 6) {
    printf("L-BFGS");
  }
  else if (obj->optmethod == 7) {
    printf("BFGS More-Thuente Line Search");
  }
  printf("\n\n");
  printf("AIC criterion : %g ",obj->aic);
  printf("\n\n");
  printf("BIC criterion : %g ",obj->bic);
  printf("\n\n");
  printf("AICC criterion : %g ",obj->aicc);
  printf("\n\n");
  if (((obj->method == 0) || (obj->method == 1)) || (obj->method == 2)) {
    printf("Log Likelihood : %g ",obj->loglik);
    printf("\n\n");
  }
  printf("Auto ARIMA Parameters ");
  printf("\n\n");
  pcVar6 = "FALSE";
  if (obj->approximation == 1) {
    pcVar6 = "TRUE";
  }
  printf("Approximation: %s \n",pcVar6);
  pcVar6 = "FALSE";
  if (obj->stepwise == 1) {
    pcVar6 = "TRUE";
  }
  printf("Stepwise: %s \n",pcVar6);
  return;
}

Assistant:

void auto_arima_summary(auto_arima_object obj) {
	int i, pq,t,ncxreg,mean,drift;
	pq = obj->p + obj->q + obj->P + obj->Q + obj->M;
	mean = obj->M - obj->r;

	if (obj->method == 0 || obj->method == 1) {
		printf("\n\nExit Status \n");
		printf("Return Code : %d \n", obj->retval);
		printf("Exit Message : ");

		if (obj->retval == 0) {
			printf("Input Error");
		}
		else if (obj->retval == 1) {
			printf("Probable Success");
		}
		else if (obj->retval == 4) {
			printf("Optimization Routine didn't converge");
		}
		else if (obj->retval == 7) {
			printf("Exogenous Variables are collinear");
		}
		else if (obj->retval == 10) {
			printf("Nonstationary AR part");
		}
		else if (obj->retval == 12) {
			printf("Nonstationary Seasonal AR part");
		}
		else if (obj->retval == 15) {
			printf("Optimization Routine Encountered Inf/Nan Values");
		}
	}
	printf("\n\n");
	printf("ARIMA Seasonal Order : ( %d, %d, %d) * (%d, %d, %d) \n",obj->p,obj->d,obj->q,
	 obj->P,obj->D,obj->Q );
	printf("\n");
	t = 0;

	printf("%-20s%-20s%-20s \n\n", "Coefficients", "Value", "Standard Error");
	for (i = 0; i < obj->p; ++i) {
		printf("AR%-15d%-20g%-20g \n", i + 1, obj->phi[i], sqrt(obj->vcov[i + pq*i]));
	}
	for (i = 0; i < obj->q; ++i) {
		t = obj->p + i;
		printf("MA%-15d%-20g%-20g \n", i + 1, obj->theta[i], sqrt(obj->vcov[t + pq * t]));
	}
	for (i = 0; i < obj->P; ++i) {
		t = obj->p + obj->q + i;
		printf("SAR%-14d%-20g%-20g \n", i + 1, obj->PHI[i], sqrt(obj->vcov[t + pq * t]));
	}
	for (i = 0; i < obj->Q; ++i) {
		t = obj->p + obj->q + obj->P + i;
		printf("SMA%-14d%-20g%-20g \n", i + 1, obj->THETA[i], sqrt(obj->vcov[t + pq * t]));
	}
	printf("\n");
	t = obj->p + obj->q + obj->P + obj->Q;
	if (mean > 0) {
		printf("%-17s%-20g%-20g \n", "MEAN", obj->mean, sqrt(obj->vcov[t + pq * t]));
		t++;
		
	}
	else {
		printf("%-17s%-20g \n", "MEAN", obj->mean);
	}
	ncxreg = 0;
	if (obj->idrift == 1) {
		printf("%-17s%-20g%-20g \n", "TREND", obj->exog[0], sqrt(obj->vcov[t + pq * t]));
		t++;
		ncxreg++;
	} else {
		printf("%-17s%-20g \n", "TREND", 0.0);
	}
	for(i = ncxreg; i < obj->r; ++i) {
		printf("%-17s%-20g%-20g \n", "EXOG", obj->exog[i], sqrt(obj->vcov[t + pq * t]));
		t++;
	}
	printf("\n");
	printf("%-17s%-20g \n", "SIGMA^2", obj->sigma2);
	printf("\n");
	printf("ESTIMATION METHOD : ");
	if (obj->method == 0) {
		printf("CSS-MLE");
	}
	else if (obj->method == 1) {
		printf("MLE");
	}
	else if (obj->method == 2) {
		printf("CSS");
	}
	printf("\n\n");
	printf("OPTIMIZATION METHOD : ");
	
	if (obj->optmethod == 0) {
		printf("Nelder-Mead");
	}
	else if (obj->optmethod == 1) {
		printf("Newton Line Search");
	}
	else if (obj->optmethod == 2) {
		printf("Newton Trust Region - Hook Step");
	}
	else if (obj->optmethod == 3) {
		printf("Newton Trust Region - Double Dog-Leg");
	}
	else if (obj->optmethod == 4) {
		printf("Conjugate Gradient");
	}
	else if (obj->optmethod == 5) {
		printf("BFGS");
	}
	else if (obj->optmethod == 6) {
		printf("L-BFGS");
	}
	else if (obj->optmethod == 7) {
		printf("BFGS More-Thuente Line Search");
	}
	
	printf("\n\n");
	
	printf("AIC criterion : %g ", obj->aic);
	printf("\n\n");
	printf("BIC criterion : %g ", obj->bic);
	printf("\n\n");
	printf("AICC criterion : %g ", obj->aicc);
	printf("\n\n");
	if (obj->method == 0 || obj->method == 1 || obj->method == 2) {
		printf("Log Likelihood : %g ", obj->loglik);
		printf("\n\n");
	}
	printf("Auto ARIMA Parameters ");
	printf("\n\n");
	printf("Approximation: %s \n", obj->approximation == 1 ? "TRUE" : "FALSE");
	printf("Stepwise: %s \n", obj->stepwise == 1 ? "TRUE" : "FALSE");
}